

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void UnaryExpression_not_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  undefined1 local_68 [8];
  JsValue r1;
  JsValue r2;
  JsValue r3;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_68);
  res_00 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_68,res_00);
  JsToBoolean(res_00,(JsValue *)((long)&r2.u + 8));
  res->type = JS_BOOLEAN;
  *(uint *)&res->u = (uint)(r3.type != JS_NULL);
  return;
}

Assistant:

static void
UnaryExpression_not_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1, r2, r3;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	JsToBoolean( &r2, &r3);
	res->type = JS_BOOLEAN;
	if(r3.u.boolean == TRUE){
		res->u.boolean  = FALSE;
	}else{
		res->u.boolean  = TRUE;
	}
}